

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O1

Result __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::calculate<false>
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,
          Trajectory<3UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  double *pdVar1;
  optional<double> *poVar2;
  size_t *psVar3;
  Block *pBVar4;
  Profile *this_00;
  undefined8 *puVar5;
  double dVar6;
  ControlInterface CVar7;
  DurationDiscretization DVar8;
  ControlSigns CVar9;
  pointer paVar10;
  undefined8 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined8 uVar14;
  bool bVar15;
  char cVar16;
  byte bVar17;
  StandardVector<Synchronization,_3UL> *pSVar18;
  long lVar19;
  Synchronization *pSVar20;
  long lVar21;
  size_t sVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  StandardVector<Block,_3UL> *pSVar27;
  long lVar28;
  byte bVar29;
  ulong uVar30;
  StandardVector<Block,_3UL> *pSVar31;
  long lVar32;
  Profile *pPVar33;
  _Storage<unsigned_long,_true> _Var34;
  bool bVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  Result local_e8c;
  _Storage<unsigned_long,_true> local_e70;
  char local_e68;
  StandardVector<Synchronization,_3UL> *local_e60;
  Container<double> *local_e58;
  double local_e50;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  local_e50 = delta_time;
  std::vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
  ::resize(&traj->profiles,1);
  local_e58 = &traj->cumulative_times;
  std::vector<double,_std::allocator<double>_>::resize(local_e58,1);
  bVar35 = this->degrees_of_freedom != 0;
  if (bVar35) {
    local_e60 = (StandardVector<Synchronization,_3UL> *)&inp->control_interface;
    lVar32 = 0;
    lVar24 = 0;
    lVar25 = 0;
    uVar30 = 0;
    do {
      if ((inp->min_velocity).super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
        dVar36 = *(double *)
                  ((long)&(((optional<std::array<double,_3UL>_> *)(&inp->max_jerk + 1))->
                          super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
                          super__Optional_payload_base<std::array<double,_3UL>_>._M_payload +
                  uVar30 * 8);
      }
      else {
        dVar36 = -(inp->max_velocity)._M_elems[uVar30];
      }
      paVar10 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->inp_min_velocity)._M_elems[uVar30] = dVar36;
      if ((inp->min_acceleration).super__Optional_base<std::array<double,_3UL>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
        dVar39 = *(double *)((long)(&inp->max_jerk + 2) + uVar30 * 8 + 8);
      }
      else {
        dVar39 = -(inp->max_acceleration)._M_elems[uVar30];
      }
      (this->inp_min_acceleration)._M_elems[uVar30] = dVar39;
      pSVar18 = (StandardVector<Synchronization,_3UL> *)((long)(&inp->enabled + 1) + lVar24 + 1);
      if ((inp->per_dof_control_interface).
          super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged ==
          false) {
        pSVar18 = local_e60;
      }
      CVar7 = pSVar18->_M_elems[0];
      (this->inp_per_dof_control_interface)._M_elems[uVar30] = CVar7;
      pSVar20 = (Synchronization *)((long)(&inp->enabled + 6) + lVar24 + 2);
      if ((inp->per_dof_synchronization).
          super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>._M_engaged ==
          false) {
        pSVar20 = &inp->synchronization;
      }
      (this->inp_per_dof_synchronization)._M_elems[uVar30] = *pSVar20;
      if ((inp->enabled)._M_elems[uVar30] == false) {
        *(double *)((long)&paVar10->_M_elems[0].p + lVar25 + 0x38U) =
             (inp->current_position)._M_elems[uVar30];
        *(double *)((long)&paVar10->_M_elems[0].v + lVar25 + 0x38U) =
             (inp->current_velocity)._M_elems[uVar30];
        *(double *)((long)&paVar10->_M_elems[0].a + lVar25 + 0x38U) =
             (inp->current_acceleration)._M_elems[uVar30];
        *(undefined8 *)((long)&paVar10->_M_elems[0].t_sum + lVar25 + 0x30U) = 0;
        *(undefined8 *)((long)&(this->blocks)._M_elems[0].t_min + lVar32 * 2) = 0;
        if (*(char *)((long)&(this->blocks)._M_elems[0].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar32 * 2) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].a.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar32 * 2) =
               0;
        }
        bVar15 = false;
        if (*(char *)((long)&(this->blocks)._M_elems[0].b.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar32 * 2) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].b.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar32 * 2) =
               0;
        }
      }
      else {
        if (CVar7 == Velocity) {
          dVar36 = (inp->max_jerk)._M_elems[uVar30];
          if (ABS(dVar36) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            ruckig::BrakeProfile::get_velocity_brake_trajectory
                      ((inp->current_acceleration)._M_elems[uVar30],
                       (inp->max_acceleration)._M_elems[uVar30],dVar39,dVar36);
          }
          dVar39 = (inp->current_position)._M_elems[uVar30];
          dVar36 = (inp->current_velocity)._M_elems[uVar30];
          dVar37 = (inp->current_acceleration)._M_elems[uVar30];
          dVar6 = (inp->target_velocity)._M_elems[uVar30];
          dVar38 = (inp->target_acceleration)._M_elems[uVar30];
          lVar19 = 0x220;
          lVar21 = 0x228;
          lVar23 = 0x128;
          lVar26 = 0xe8;
          lVar28 = 0xa8;
LAB_0010b81f:
          *(double *)((long)&paVar10->_M_elems[0].t + lVar25 + lVar28) = dVar37;
          *(double *)((long)&paVar10->_M_elems[0].t + lVar25 + lVar26) = dVar36;
          *(double *)((long)&paVar10->_M_elems[0].t + lVar25 + lVar23) = dVar39;
          *(double *)((long)&paVar10->_M_elems[0].t + lVar25 + lVar21) = dVar38;
          *(double *)((long)&paVar10->_M_elems[0].t + lVar25 + lVar19) = dVar6;
        }
        else if (CVar7 == Position) {
          dVar38 = (inp->max_jerk)._M_elems[uVar30];
          if (ABS(dVar38) == INFINITY) {
            dVar38 = (inp->max_acceleration)._M_elems[uVar30];
            if (ABS(dVar38) != INFINITY) {
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        ((inp->current_velocity)._M_elems[uVar30],
                         (inp->max_velocity)._M_elems[uVar30],dVar36,dVar38,dVar39);
            }
          }
          else {
            ruckig::BrakeProfile::get_position_brake_trajectory
                      ((inp->current_velocity)._M_elems[uVar30],
                       (inp->current_acceleration)._M_elems[uVar30],
                       (inp->max_velocity)._M_elems[uVar30],dVar36,
                       (inp->max_acceleration)._M_elems[uVar30],dVar39,dVar38);
          }
          dVar36 = (inp->current_position)._M_elems[uVar30];
          dVar37 = (inp->current_velocity)._M_elems[uVar30];
          dVar6 = (inp->target_position)._M_elems[uVar30];
          dVar38 = (inp->target_velocity)._M_elems[uVar30];
          dVar39 = (inp->target_acceleration)._M_elems[uVar30];
          *(double *)((long)&paVar10->_M_elems[0].a + lVar25) =
               (inp->current_acceleration)._M_elems[uVar30];
          lVar19 = 0x218;
          lVar21 = 0x220;
          lVar23 = 0x228;
          lVar26 = 0x128;
          lVar28 = 0xe8;
          goto LAB_0010b81f;
        }
        if (ABS((inp->max_jerk)._M_elems[uVar30]) == INFINITY) {
          if (ABS((inp->max_acceleration)._M_elems[uVar30]) != INFINITY) {
            BrakeProfile::finalize_second_order
                      ((BrakeProfile *)((long)&paVar10->_M_elems[0].brake + lVar25),
                       (double *)((long)&paVar10->_M_elems[0].p + lVar25),
                       (double *)((long)&paVar10->_M_elems[0].v + lVar25),
                       (double *)((long)&paVar10->_M_elems[0].a + lVar25));
          }
        }
        else {
          BrakeProfile::finalize
                    ((BrakeProfile *)((long)&paVar10->_M_elems[0].brake + lVar25),
                     (double *)((long)&paVar10->_M_elems[0].p + lVar25),
                     (double *)((long)&paVar10->_M_elems[0].v + lVar25),
                     (double *)((long)&paVar10->_M_elems[0].a + lVar25));
        }
        pBVar4 = (Block *)((long)&paVar10->_M_elems[0].t + lVar25);
        CVar7 = (this->inp_per_dof_control_interface)._M_elems[uVar30];
        if (CVar7 == Velocity) {
          dVar36 = (inp->max_jerk)._M_elems[uVar30];
          if (ABS(dVar36) == INFINITY) {
            ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                      ((VelocitySecondOrderStep1 *)local_e48,
                       *(double *)((long)&paVar10->_M_elems[0].v + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x60U),
                       (inp->max_acceleration)._M_elems[uVar30],
                       (this->inp_min_acceleration)._M_elems[uVar30]);
            cVar16 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,pBVar4);
          }
          else {
            ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                      ((VelocityThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar10->_M_elems[0].v + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].a + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x60U),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x68U),
                       (inp->max_acceleration)._M_elems[uVar30],
                       (this->inp_min_acceleration)._M_elems[uVar30],dVar36);
            cVar16 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,pBVar4);
          }
LAB_0010bb7c:
          if (cVar16 != '\0') {
            (traj->independent_min_durations)._M_elems[uVar30] =
                 *(double *)((long)&(this->blocks)._M_elems[0].t_min + lVar32 * 2);
            bVar15 = false;
            goto LAB_0010bbf2;
          }
        }
        else if (CVar7 == Position) {
          dVar36 = (inp->max_jerk)._M_elems[uVar30];
          if (ABS(dVar36) == INFINITY) {
            dVar36 = (inp->max_acceleration)._M_elems[uVar30];
            if (ABS(dVar36) == INFINITY) {
              ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                        ((PositionFirstOrderStep1 *)local_e48,
                         *(double *)((long)&paVar10->_M_elems[0].p + lVar25),
                         *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x58U),
                         (inp->max_velocity)._M_elems[uVar30],
                         (this->inp_min_velocity)._M_elems[uVar30]);
              cVar16 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,pBVar4);
            }
            else {
              ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                        ((PositionSecondOrderStep1 *)local_e48,
                         *(double *)((long)&paVar10->_M_elems[0].p + lVar25),
                         *(double *)((long)&paVar10->_M_elems[0].v + lVar25),
                         *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x58U),
                         *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x60U),
                         (inp->max_velocity)._M_elems[uVar30],
                         (this->inp_min_velocity)._M_elems[uVar30],dVar36,
                         (this->inp_min_acceleration)._M_elems[uVar30]);
              cVar16 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,pBVar4);
            }
          }
          else {
            ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                      ((PositionThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar10->_M_elems[0].p + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].v + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].a + lVar25),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x58U),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x60U),
                       *(double *)((long)&paVar10->_M_elems[0].accel + lVar25 + 0x68U),
                       (inp->max_velocity)._M_elems[uVar30],
                       (this->inp_min_velocity)._M_elems[uVar30],
                       (inp->max_acceleration)._M_elems[uVar30],
                       (this->inp_min_acceleration)._M_elems[uVar30],dVar36);
            cVar16 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar4);
          }
          goto LAB_0010bb7c;
        }
        dVar36 = (inp->max_acceleration)._M_elems[uVar30];
        bVar15 = true;
        if (((dVar36 == 0.0) && (!NAN(dVar36))) ||
           ((dVar36 = (this->inp_min_acceleration)._M_elems[uVar30], dVar36 == 0.0 && (!NAN(dVar36))
            ))) {
          local_e8c = ErrorZeroLimits;
        }
        else {
          pdVar1 = (inp->max_jerk)._M_elems + uVar30;
          local_e8c = ErrorZeroLimits;
          if (*pdVar1 != 0.0) {
            local_e8c = ErrorExecutionTimeCalculation;
          }
          if (NAN(*pdVar1)) {
            local_e8c = ErrorExecutionTimeCalculation;
          }
        }
      }
LAB_0010bbf2:
      if (bVar15) break;
      uVar30 = uVar30 + 1;
      lVar25 = lVar25 + 0x240;
      lVar24 = lVar24 + 4;
      lVar32 = lVar32 + 0x37c;
      bVar35 = uVar30 < this->degrees_of_freedom;
    } while (bVar35);
  }
  if (bVar35) {
    return local_e8c;
  }
  DVar8 = inp->duration_discretization;
  if ((this->degrees_of_freedom == 1 &&
      ((inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged & 1U) == 0) && DVar8 != Discrete) {
    traj->duration = (this->blocks)._M_elems[0].t_min;
    memcpy((traj->profiles).
           super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start,&this->blocks,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
    return Working;
  }
  local_e68 = '\0';
  poVar2 = &inp->minimum_duration;
  pdVar1 = &traj->duration;
  uVar11 = (poVar2->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_payload;
  uVar12 = (poVar2->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_engaged;
  uVar13 = *(undefined3 *)
            &(poVar2->super__Optional_base<double,_true,_true>)._M_payload.
             super__Optional_payload_base<double>.field_0x9;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_3_ = uVar13;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)uVar12;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)uVar11;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  bVar35 = synchronize(this,t_min,pdVar1,(optional<unsigned_long> *)&local_e70,
                       (traj->profiles).
                       super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,DVar8 == Discrete,local_e50);
  if (!bVar35) {
    if (this->degrees_of_freedom != 0) {
      sVar22 = 0;
      do {
        dVar36 = (inp->max_acceleration)._M_elems[sVar22];
        if ((dVar36 == 0.0) && (!NAN(dVar36))) {
          return ErrorZeroLimits;
        }
        dVar36 = (this->inp_min_acceleration)._M_elems[sVar22];
        if ((dVar36 == 0.0) && (!NAN(dVar36))) {
          return ErrorZeroLimits;
        }
        dVar36 = (inp->max_jerk)._M_elems[sVar22];
        if ((dVar36 == 0.0) && (!NAN(dVar36))) {
          return ErrorZeroLimits;
        }
        sVar22 = sVar22 + 1;
      } while (this->degrees_of_freedom != sVar22);
    }
    return ErrorSynchronizationCalculation;
  }
  if (this->degrees_of_freedom != 0) {
    pSVar31 = &this->blocks;
    lVar24 = 0;
    _Var34._M_value = 0;
    do {
      if (((inp->enabled)._M_elems[_Var34._M_value] == true) &&
         ((this->inp_per_dof_synchronization)._M_elems[_Var34._M_value] == None)) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
               pSVar31,0x23c);
        dVar36 = pSVar31->_M_elems[0].t_min;
        if (traj->duration <= dVar36 && dVar36 != traj->duration) {
          *pdVar1 = dVar36;
          local_e68 = '\x01';
          local_e70 = _Var34;
        }
      }
      _Var34._M_value = _Var34._M_value + 1;
      lVar24 = lVar24 + 0x240;
      pSVar31 = (StandardVector<Block,_3UL> *)(pSVar31->_M_elems + 1);
    } while (_Var34._M_value < this->degrees_of_freedom);
  }
  *(local_e58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = *pdVar1;
  dVar36 = *pdVar1;
  if (7600.0 < dVar36) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar36 == 0.0) && (!NAN(dVar36))) {
    if (this->degrees_of_freedom == 0) {
      return Working;
    }
    pSVar31 = &this->blocks;
    lVar24 = 0;
    uVar30 = 0;
    do {
      memcpy((void *)((long)&((traj->profiles).
                              super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
             pSVar31,0x23c);
      uVar30 = uVar30 + 1;
      pSVar31 = (StandardVector<Block,_3UL> *)(pSVar31->_M_elems + 1);
      lVar24 = lVar24 + 0x240;
    } while (uVar30 < this->degrees_of_freedom);
    return Working;
  }
  if ((DVar8 != Discrete) &&
     (pSVar20 = std::
                __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>>
                          (&this->inp_per_dof_synchronization,&this->degrees_of_freedom),
     pSVar20 == (Synchronization *)&this->degrees_of_freedom)) {
    return Working;
  }
  if (local_e68 != '\x01') goto LAB_0010c455;
  pSVar18 = &this->inp_per_dof_synchronization;
  psVar3 = &this->degrees_of_freedom;
  pSVar20 = std::
            __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_pred<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>>
                      (pSVar18,psVar3);
  _Var34 = local_e70;
  if (pSVar20 == (Synchronization *)psVar3) goto LAB_0010c455;
  if (local_e68 == '\0') {
    std::__throw_bad_optional_access();
  }
  paVar10 = (traj->profiles).
            super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar35 = is_input_collinear(this,inp,*(Direction *)
                                        ((long)(paVar10->_M_elems + (long)local_e70) + 0x234),
                              local_e70._M_value);
  if (bVar35) {
    if (this->degrees_of_freedom != 0) {
      pPVar33 = paVar10->_M_elems + (long)_Var34;
      bVar29 = 1;
      lVar24 = 0;
      uVar30 = 0;
      local_e60 = pSVar18;
      do {
        if (((inp->enabled)._M_elems[uVar30] == true) &&
           (((local_e68 != '\x01' || (uVar30 != local_e70._M_value)) &&
            ((this->inp_per_dof_synchronization)._M_elems[uVar30] == Phase)))) {
          paVar10 = (traj->profiles).
                    super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          this_00 = (Profile *)((long)&paVar10->_M_elems[0].t + lVar24);
          *(double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x30) =
               *(double *)((long)&pPVar33->t + 0x30);
          uVar14 = (pPVar33->t)._M_elems[0];
          dVar37 = *(double *)((long)&pPVar33->t + 8);
          dVar39 = *(double *)((long)&pPVar33->t + 0x10);
          dVar38 = *(double *)((long)&pPVar33->t + 0x18);
          dVar36 = *(double *)((long)&pPVar33->t + 0x28);
          pdVar1 = (double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x20);
          *pdVar1 = *(double *)((long)&pPVar33->t + 0x20);
          pdVar1[1] = dVar36;
          pdVar1 = (double *)((long)&paVar10->_M_elems[0].t + lVar24 + 0x10);
          *pdVar1 = dVar39;
          pdVar1[1] = dVar38;
          puVar5 = (undefined8 *)((long)&paVar10->_M_elems[0].t + lVar24);
          *puVar5 = uVar14;
          puVar5[1] = dVar37;
          CVar9 = pPVar33->control_signs;
          *(ControlSigns *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x78U) = CVar9;
          CVar7 = (this->inp_per_dof_control_interface)._M_elems[uVar30];
          if (CVar7 == Velocity) {
            if (CVar9 == UDUD) {
              dVar36 = (inp->max_jerk)._M_elems[uVar30];
              dVar39 = (this->new_phase_control)._M_elems[uVar30];
              if (ABS(dVar36) == INFINITY) {
                bVar35 = false;
                if ((dVar39 < (inp->max_acceleration)._M_elems[uVar30] + 1e-12) &&
                   ((this->inp_min_acceleration)._M_elems[uVar30] + -1e-12 < dVar39)) {
                  bVar35 = Profile::
                           check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                     (this_00,dVar39);
                }
              }
              else {
                if (ABS(dVar36) + 1e-12 <= ABS(dVar39)) goto LAB_0010c3d3;
                bVar35 = Profile::
                         check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                   (this_00,dVar39,(inp->max_acceleration)._M_elems[uVar30],
                                    (this->inp_min_acceleration)._M_elems[uVar30]);
              }
            }
            else {
              if (CVar9 != UDDU) goto LAB_0010c3d8;
              dVar36 = (inp->max_jerk)._M_elems[uVar30];
              dVar39 = (this->new_phase_control)._M_elems[uVar30];
              if (ABS(dVar36) == INFINITY) {
                bVar35 = false;
                if ((dVar39 < (inp->max_acceleration)._M_elems[uVar30] + 1e-12) &&
                   ((this->inp_min_acceleration)._M_elems[uVar30] + -1e-12 < dVar39)) {
                  bVar35 = Profile::
                           check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                     (this_00,dVar39);
                }
              }
              else {
                if (ABS(dVar36) + 1e-12 <= ABS(dVar39)) goto LAB_0010c3d3;
                bVar35 = Profile::
                         check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                   (this_00,dVar39,(inp->max_acceleration)._M_elems[uVar30],
                                    (this->inp_min_acceleration)._M_elems[uVar30]);
              }
            }
            goto LAB_0010c3d5;
          }
          if (CVar7 == Position) {
            if (CVar9 == UDUD) {
              dVar36 = (inp->max_jerk)._M_elems[uVar30];
              dVar39 = (this->new_phase_control)._M_elems[uVar30];
              if (ABS(dVar36) == INFINITY) {
                dVar36 = (this->inp_min_acceleration)._M_elems[uVar30] + -1e-12;
                if (dVar39 <= dVar36) {
LAB_0010c3d3:
                  bVar35 = false;
                }
                else {
                  dVar38 = -dVar39;
                  dVar37 = (inp->max_acceleration)._M_elems[uVar30] + 1e-12;
                  bVar35 = false;
                  if (((dVar38 < dVar37) && (dVar36 < dVar38)) && (dVar39 < dVar37)) {
                    bVar35 = Profile::
                             check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar39,dVar38,(inp->max_velocity)._M_elems[uVar30],
                                        (this->inp_min_velocity)._M_elems[uVar30]);
                  }
                }
              }
              else {
                if (ABS(dVar36) + 1e-12 <= ABS(dVar39)) goto LAB_0010c3d3;
                bVar35 = Profile::
                         check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                   (this_00,dVar39,(inp->max_velocity)._M_elems[uVar30],
                                    (this->inp_min_velocity)._M_elems[uVar30],
                                    (inp->max_acceleration)._M_elems[uVar30],
                                    (this->inp_min_acceleration)._M_elems[uVar30]);
              }
LAB_0010c3d5:
              bVar29 = bVar29 & bVar35;
            }
            else if (CVar9 == UDDU) {
              dVar36 = (inp->max_jerk)._M_elems[uVar30];
              if (ABS(dVar36) == INFINITY) {
                dVar36 = (inp->max_acceleration)._M_elems[uVar30];
                dVar39 = (this->new_phase_control)._M_elems[uVar30];
                if (ABS(dVar36) == INFINITY) {
                  bVar35 = false;
                  if ((dVar39 < (inp->max_velocity)._M_elems[uVar30] + 1e-12) &&
                     ((this->inp_min_velocity)._M_elems[uVar30] + -1e-12 < dVar39)) {
                    bVar35 = Profile::
                             check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar39);
                  }
                }
                else {
                  dVar38 = (this->inp_min_acceleration)._M_elems[uVar30] + -1e-12;
                  if (dVar39 <= dVar38) goto LAB_0010c3d3;
                  dVar37 = -dVar39;
                  dVar36 = dVar36 + 1e-12;
                  bVar35 = false;
                  if (((dVar37 < dVar36) && (dVar39 < dVar36)) && (dVar38 < dVar37)) {
                    bVar35 = Profile::
                             check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar39,dVar37,(inp->max_velocity)._M_elems[uVar30],
                                        (this->inp_min_velocity)._M_elems[uVar30]);
                  }
                }
              }
              else {
                dVar39 = (this->new_phase_control)._M_elems[uVar30];
                if (ABS(dVar36) + 1e-12 <= ABS(dVar39)) goto LAB_0010c3d3;
                bVar35 = Profile::
                         check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                   (this_00,dVar39,(inp->max_velocity)._M_elems[uVar30],
                                    (this->inp_min_velocity)._M_elems[uVar30],
                                    (inp->max_acceleration)._M_elems[uVar30],
                                    (this->inp_min_acceleration)._M_elems[uVar30]);
              }
              goto LAB_0010c3d5;
            }
          }
LAB_0010c3d8:
          *(ReachedLimits *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x70U) = pPVar33->limits;
        }
        uVar30 = uVar30 + 1;
        lVar24 = lVar24 + 0x240;
      } while (uVar30 < this->degrees_of_freedom);
      pSVar18 = local_e60;
      if (bVar29 == 0) goto LAB_0010c441;
    }
    pSVar20 = std::
              __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                        (pSVar18,psVar3);
    if (pSVar20 != (Synchronization *)psVar3) goto LAB_0010c441;
    bVar35 = false;
    local_e8c = Working;
  }
  else {
LAB_0010c441:
    bVar35 = true;
  }
  if (!bVar35) {
    return local_e8c;
  }
LAB_0010c455:
  if (this->degrees_of_freedom == 0) {
    return Working;
  }
  pSVar31 = &this->blocks;
  lVar24 = 0;
  uVar30 = 0;
  do {
    if (((local_e68 == '\x01') && (uVar30 == local_e70._M_value)) ||
       (bVar35 = true, (this->inp_per_dof_synchronization)._M_elems[uVar30] == None)) {
      bVar35 = DVar8 == Discrete;
    }
    bVar29 = 0x18;
    if ((bVar35 & (inp->enabled)._M_elems[uVar30]) == 1) {
      paVar10 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar36 = (traj->duration - *(double *)((long)&paVar10->_M_elems[0].brake + lVar24)) -
               *(double *)((long)&paVar10->_M_elems[0].accel + lVar24);
      pSVar27 = pSVar31;
      if (((((this->inp_per_dof_synchronization)._M_elems[uVar30] != TimeIfNecessary) ||
           (2.220446049250313e-16 <= ABS((inp->target_velocity)._M_elems[uVar30]))) ||
          (2.220446049250313e-16 <= ABS((inp->target_acceleration)._M_elems[uVar30]))) &&
         (4.440892098500626e-16 <= ABS(dVar36 - pSVar31->_M_elems[0].t_min))) {
        if ((pSVar31->_M_elems[0].a.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged != true) ||
           (4.440892098500626e-16 <=
            ABS(dVar36 - *(double *)
                          ((long)&pSVar31->_M_elems[0].a.
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                  _M_payload + 8)))) {
          if ((pSVar31->_M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
               _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged != true)
             || (4.440892098500626e-16 <=
                 ABS(dVar36 - *(double *)
                               ((long)&pSVar31->_M_elems[0].b.
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload.
                                       super__Optional_payload_base<ruckig::Block::Interval>.
                                       _M_payload + 8)))) {
            CVar7 = (this->inp_per_dof_control_interface)._M_elems[uVar30];
            if (CVar7 == Velocity) {
              dVar39 = (inp->max_jerk)._M_elems[uVar30];
              if (ABS(dVar39) == INFINITY) {
                ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                          ((VelocitySecondOrderStep2 *)local_e48,dVar36,
                           *(double *)((long)&paVar10->_M_elems[0].v + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x60U),
                           (inp->max_acceleration)._M_elems[uVar30],
                           (this->inp_min_acceleration)._M_elems[uVar30]);
                bVar17 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
              }
              else {
                ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                          ((VelocityThirdOrderStep2 *)local_e48,dVar36,
                           *(double *)((long)&paVar10->_M_elems[0].v + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].a + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x60U),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x68U),
                           (inp->max_acceleration)._M_elems[uVar30],
                           (this->inp_min_acceleration)._M_elems[uVar30],dVar39);
                bVar17 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
              }
            }
            else if (CVar7 == Position) {
              dVar39 = (inp->max_jerk)._M_elems[uVar30];
              if (ABS(dVar39) == INFINITY) {
                dVar39 = (inp->max_acceleration)._M_elems[uVar30];
                if (ABS(dVar39) == INFINITY) {
                  ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                            ((PositionFirstOrderStep2 *)local_e48,dVar36,
                             *(double *)((long)&paVar10->_M_elems[0].p + lVar24),
                             *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x58U),
                             (inp->max_velocity)._M_elems[uVar30],
                             (this->inp_min_velocity)._M_elems[uVar30]);
                  bVar17 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                }
                else {
                  ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                            ((PositionSecondOrderStep2 *)local_e48,dVar36,
                             *(double *)((long)&paVar10->_M_elems[0].p + lVar24),
                             *(double *)((long)&paVar10->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x58U),
                             *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x60U),
                             (inp->max_velocity)._M_elems[uVar30],
                             (this->inp_min_velocity)._M_elems[uVar30],dVar39,
                             (this->inp_min_acceleration)._M_elems[uVar30]);
                  bVar17 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                }
              }
              else {
                ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                          ((PositionThirdOrderStep2 *)local_e48,dVar36,
                           *(double *)((long)&paVar10->_M_elems[0].p + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].v + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].a + lVar24),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x58U),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x60U),
                           *(double *)((long)&paVar10->_M_elems[0].accel + lVar24 + 0x68U),
                           (inp->max_velocity)._M_elems[uVar30],
                           (this->inp_min_velocity)._M_elems[uVar30],
                           (inp->max_acceleration)._M_elems[uVar30],
                           (this->inp_min_acceleration)._M_elems[uVar30],dVar39);
                bVar17 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
              }
            }
            else {
              bVar17 = 0;
            }
            bVar29 = bVar17 ^ 1;
            if (bVar17 == 0) {
              local_e8c = ErrorSynchronizationCalculation;
            }
            goto LAB_0010c843;
          }
          pSVar27 = (StandardVector<Block,_3UL> *)
                    ((long)&pSVar31->_M_elems[0].b.
                            super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                            super__Optional_payload_base<ruckig::Block::Interval>._M_payload + 0x10)
          ;
        }
        else {
          pSVar27 = (StandardVector<Block,_3UL> *)
                    ((long)&pSVar31->_M_elems[0].a.
                            super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                            super__Optional_payload_base<ruckig::Block::Interval>._M_payload + 0x10)
          ;
        }
      }
      memcpy((void *)((long)&paVar10->_M_elems[0].t + lVar24),pSVar27,0x23c);
    }
LAB_0010c843:
    if ((bVar29 != 0x18) && (bVar29 != 0)) {
      return local_e8c;
    }
    uVar30 = uVar30 + 1;
    lVar24 = lVar24 + 0x240;
    pSVar31 = (StandardVector<Block,_3UL> *)(pSVar31->_M_elems + 1);
    if (this->degrees_of_freedom <= uVar30) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }